

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void compact_array_suite::test_int64(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined8 uStack_118;
  output_type expected [34];
  undefined1 auStack_e8 [8];
  array<long,_4UL> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  value._M_elems[1] = -0x8000000000000000;
  value._M_elems[2] = 0x7fffffffffffffff;
  auStack_e8 = (undefined1  [8])0x0;
  value._M_elems[0] = -1;
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (array<long,_4UL> *)auStack_e8);
  expected[8] = 0xff;
  expected[9] = 0xff;
  expected[10] = '\0';
  expected[0xb] = '\0';
  expected[0xc] = '\0';
  expected[0xd] = '\0';
  expected[0xe] = '\0';
  expected[0xf] = '\0';
  expected[0x10] = '\0';
  expected[0x11] = 0x80;
  expected[0x12] = 0xff;
  expected[0x13] = 0xff;
  expected[0x14] = 0xff;
  expected[0x15] = 0xff;
  expected[0x16] = 0xff;
  expected[0x17] = 0xff;
  uStack_118 = 0x20ae;
  expected[0] = '\0';
  expected[1] = '\0';
  expected[2] = 0xff;
  expected[3] = 0xff;
  expected[4] = 0xff;
  expected[5] = 0xff;
  expected[6] = 0xff;
  expected[7] = 0xff;
  expected[0x18] = 0xff;
  expected[0x19] = '\x7f';
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0xb8,"void compact_array_suite::test_int64()",iVar1._M_current,iVar2._M_current,
             &uStack_118,expected + 0x1a);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_int64()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::array<std::int64_t, 4> value = {{0, -1, std::numeric_limits<std::int64_t>::min(), std::numeric_limits<std::int64_t>::max()}};
    ar << value;

    output_type expected[] = { token::code::array8_int64, 4 * token::int64::size,
                               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                               0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
                               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x80,
                               0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x7F };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}